

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O3

void Omega_h::map_into<int>(Read<int> *a_data,Graph *a2b,Write<int> *b_data,Int width)

{
  int *piVar1;
  Alloc *pAVar2;
  Read<int> ab_data;
  LOs local_90;
  Write<int> local_80;
  Read<int> local_70;
  Read<int> local_60;
  LOs local_50;
  Alloc *local_40;
  void *local_38;
  
  local_60.write_.shared_alloc_.alloc = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.write_.shared_alloc_.alloc)->use_count =
           (local_60.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_60.write_.shared_alloc_.direct_ptr = (a_data->write_).shared_alloc_.direct_ptr;
  local_50.write_.shared_alloc_.alloc = (a2b->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50.write_.shared_alloc_.alloc =
           (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_50.write_.shared_alloc_.alloc)->use_count =
           (local_50.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_50.write_.shared_alloc_.direct_ptr = (a2b->a2ab).write_.shared_alloc_.direct_ptr;
  expand<int>((Omega_h *)&local_40,&local_60,&local_50,width);
  pAVar2 = local_50.write_.shared_alloc_.alloc;
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_60.write_.shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_70.write_.shared_alloc_.alloc = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.write_.shared_alloc_.alloc = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  local_70.write_.shared_alloc_.direct_ptr = local_38;
  local_90.write_.shared_alloc_.alloc = (a2b->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc =
           (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_90.write_.shared_alloc_.alloc)->use_count =
           (local_90.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.write_.shared_alloc_.direct_ptr = (a2b->ab2b).write_.shared_alloc_.direct_ptr;
  local_80.shared_alloc_.alloc = (b_data->shared_alloc_).alloc;
  if (((ulong)local_80.shared_alloc_.alloc & 7) == 0 && local_80.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_80.shared_alloc_.alloc = (Alloc *)((local_80.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_80.shared_alloc_.alloc)->use_count = (local_80.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_80.shared_alloc_.direct_ptr = (b_data->shared_alloc_).direct_ptr;
  map_into<int>(&local_70,&local_90,&local_80,width);
  pAVar2 = local_80.shared_alloc_.alloc;
  if (((ulong)local_80.shared_alloc_.alloc & 7) == 0 && local_80.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_80.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_70.write_.shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    piVar1 = &local_40->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40);
      operator_delete(local_40,0x48);
    }
  }
  return;
}

Assistant:

void map_into(Read<T> a_data, Graph a2b, Write<T> b_data, Int width) {
  auto ab_data = expand(a_data, a2b.a2ab, width);
  map_into(ab_data, a2b.ab2b, b_data, width);
}